

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapJavascriptAsyncSpawnStepFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  bool isReject;
  uint uVar1;
  ScriptContext *pSVar2;
  SnapJavascriptAsyncSpawnStepFunctionInfo *pSVar3;
  Var resolve;
  Var argument;
  JavascriptGenerator *generator;
  JavascriptAsyncSpawnStepFunction *pJVar4;
  Var local_38;
  
  pSVar2 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pSVar3 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapJavascriptAsyncSpawnStepFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)40>
                     (snpObject);
  if (pSVar3->reject == (TTDVar)0x0) {
    local_38 = (Var)0x0;
  }
  else {
    local_38 = InflateMap::InflateTTDVar(inflator,pSVar3->reject);
  }
  if (pSVar3->resolve == (TTDVar)0x0) {
    resolve = (Var)0x0;
  }
  else {
    resolve = InflateMap::InflateTTDVar(inflator,pSVar3->resolve);
  }
  if (pSVar3->argument == (TTDVar)0x0) {
    argument = (Var)0x0;
  }
  else {
    argument = InflateMap::InflateTTDVar(inflator,pSVar3->argument);
  }
  isReject = pSVar3->isReject;
  if (pSVar3->generator == 0) {
    generator = (JavascriptGenerator *)0x0;
  }
  else {
    generator = (JavascriptGenerator *)InflateMap::LookupObject(inflator,pSVar3->generator);
  }
  uVar1 = pSVar3->entryPoint - 1;
  if (uVar1 < 3) {
    pJVar4 = Js::JavascriptLibrary::CreateAsyncSpawnStepFunction
                       ((pSVar2->super_ScriptContextBase).javascriptLibrary,
                        (JavascriptMethod)(&PTR_EntryAsyncSpawnStepNextFunction_013832d0)[uVar1],
                        generator,argument,resolve,local_38,isReject);
    return (RecyclableObject *)pJVar4;
  }
  TTDAbort_unrecoverable_error
            ("Unexpected value for entryPoint when inflating JavascriptAsyncSpawnStepFunction");
}

Assistant:

Js::RecyclableObject *DoObjectInflation_SnapJavascriptAsyncSpawnStepFunctionInfo(const SnapObject *snpObject, InflateMap *inflator)
        {
            Js::ScriptContext *ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapJavascriptAsyncSpawnStepFunctionInfo* info = SnapObjectGetAddtlInfoAs<SnapJavascriptAsyncSpawnStepFunctionInfo *, SnapObjectType::JavascriptAsyncSpawnStepFunction>(snpObject);
            Js::Var reject = (info->reject != nullptr) ? inflator->InflateTTDVar(info->reject) : nullptr;
            Js::Var resolve = (info->resolve != nullptr) ? inflator->InflateTTDVar(info->resolve) : nullptr;
            Js::Var argument = (info->argument != nullptr) ? inflator->InflateTTDVar(info->argument) : nullptr;
            bool isReject = info->isReject;

            Js::JavascriptGenerator* generator = nullptr;
            if (info->generator != TTD_INVALID_PTR_ID)
            {
                generator = reinterpret_cast<Js::JavascriptGenerator*>(inflator->LookupObject(info->generator));
            }

            Js::JavascriptMethod entryPoint = nullptr;
            switch (info->entryPoint)
            {
            case 1:
                entryPoint = Js::JavascriptAsyncFunction::EntryAsyncSpawnStepNextFunction;
                break;
            case 2:
                entryPoint = Js::JavascriptAsyncFunction::EntryAsyncSpawnStepThrowFunction;
                break;
            case 3:
                entryPoint = Js::JavascriptAsyncFunction::EntryAsyncSpawnCallStepFunction;
                break;
            default:
                TTDAssert(false, "Unexpected value for entryPoint when inflating JavascriptAsyncSpawnStepFunction");
                break;
            }

            return ctx->GetLibrary()->CreateAsyncSpawnStepFunction(entryPoint, generator, argument, resolve, reject, isReject);
        }